

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

int __thiscall CServer::ClientCountry(CServer *this,int ClientID)

{
  int iVar1;
  
  iVar1 = -1;
  if (((uint)ClientID < 0x40) && (this->m_aClients[(uint)ClientID].m_State == 5)) {
    iVar1 = this->m_aClients[(uint)ClientID].m_Country;
  }
  return iVar1;
}

Assistant:

int CServer::ClientCountry(int ClientID) const
{
	if(ClientID < 0 || ClientID >= MAX_CLIENTS || m_aClients[ClientID].m_State == CServer::CClient::STATE_EMPTY)
		return -1;
	if(m_aClients[ClientID].m_State == CServer::CClient::STATE_INGAME)
		return m_aClients[ClientID].m_Country;
	else
		return -1;
}